

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jtalk.c
# Opt level: O0

char * u8tou8_path(char *source,char *dest)

{
  size_t sVar1;
  char *in_RSI;
  char *in_RDI;
  int size;
  undefined8 local_8;
  
  if ((in_RSI == (char *)0x0) || (in_RDI == (char *)0x0)) {
    g_lastError = OPENJTALKERROR_CHARSET_CONVERTING_ERROR;
    local_8 = (char *)0x0;
  }
  else {
    sVar1 = strlen(in_RDI);
    if ((int)sVar1 < 0x104) {
      local_8 = strcpy(in_RSI,in_RDI);
    }
    else {
      g_lastError = OPENJTALKERROR_CHARSET_CONVERTING_ERROR;
      local_8 = (char *)0x0;
    }
  }
  return local_8;
}

Assistant:

char *u8tou8_path(const char *source, char *dest)
{
	if (dest == NULL || source == NULL)
	{
		g_lastError = OPENJTALKERROR_CHARSET_CONVERTING_ERROR;
		return NULL;
	}
	int size = strlen(source);
	if (size >= MAX_PATH)
	{
		g_lastError = OPENJTALKERROR_CHARSET_CONVERTING_ERROR;
		return NULL;
	}
	return strcpy(dest, source);
}